

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

char * dirname(char *__path)

{
  char *pcVar1;
  int *piVar2;
  size_t __n;
  
  pcVar1 = strrchr(__path,0x2f);
  if (pcVar1 == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    dief("dirname: no slash in given path:%s",__path);
  }
  __n = (long)pcVar1 - (long)__path;
  pcVar1 = (char *)malloc(__n + 1);
  if (pcVar1 != (char *)0x0) {
    memcpy(pcVar1,__path,__n);
    pcVar1[__n] = '\0';
    return pcVar1;
  }
  dief("no memory");
}

Assistant:

static char *dirname(const char *path)
{
    const char *last_slash = strrchr(path, '/');
    char *ret;

    if (last_slash == NULL) {
        errno = 0;
        dief("dirname: no slash in given path:%s", path);
    }
    if ((ret = malloc(last_slash + 1 - path)) == NULL)
        dief("no memory");
    memcpy(ret, path, last_slash - path);
    ret[last_slash - path] = '\0';
    return ret;
}